

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandDrawInventoryBar::Draw
          (CommandDrawInventoryBar *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  Styles SVar1;
  CommandDrawNumber *pCVar2;
  uint uVar3;
  int iVar4;
  AInventory *pAVar5;
  APlayerPawn *pAVar6;
  FImageCollection *this_00;
  FTexture *pFVar7;
  AInventory *pAVar8;
  SBarInfoCoordinate y;
  int iVar9;
  ulong uVar10;
  SBarInfoCoordinate SVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  SBarInfoCoordinate x;
  int iVar15;
  SBarInfoCoordinate y_00;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  double Alpha;
  double Alpha_00;
  
  iVar4 = GetCounterSpacing(this,statusBar);
  Alpha = block->currentAlpha;
  if (this->translucent != false) {
    Alpha = Alpha * 0.59375;
  }
  pAVar5 = DBaseStatusBar::ValidateInvFirst(&statusBar->super_DBaseStatusBar,this->size);
  (((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvFirst).field_0.p = pAVar5;
  pAVar6 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
  pAVar5 = (pAVar6->InvFirst).field_0.p;
  if (pAVar5 == (AInventory *)0x0) {
LAB_00624331:
    if (this->alwaysShow != true) {
      return;
    }
    pAVar6 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pAVar5 = (pAVar6->InvFirst).field_0.p;
    if (pAVar5 != (AInventory *)0x0) goto LAB_00624357;
LAB_00624715:
    uVar12 = this->size;
    bVar17 = true;
    uVar13 = 0;
  }
  else {
    if (((pAVar5->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
      (pAVar6->InvFirst).field_0.p = (AInventory *)0x0;
      goto LAB_00624331;
    }
LAB_00624357:
    if (((pAVar5->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
      (pAVar6->InvFirst).field_0.p = (AInventory *)0x0;
      goto LAB_00624715;
    }
    if (this->size == 0) {
      uVar13 = 0;
      bVar17 = false;
      uVar12 = 0;
    }
    else {
      this_00 = &statusBar->Images;
      iVar9 = 0;
      uVar13 = 0;
      do {
        bVar17 = this->vertical != false;
        iVar14 = iVar9;
        if (bVar17) {
          iVar14 = 0;
        }
        iVar15 = 0;
        if (bVar17) {
          iVar15 = iVar9;
        }
        x = (SBarInfoCoordinate)(iVar14 + (int)this->x);
        y_00 = (SBarInfoCoordinate)(iVar15 + (int)this->y);
        if (this->noArtibox == false) {
          pFVar7 = FImageCollection::operator[](this_00,statusBar->invBarOffset);
          DSBarInfo::DrawGraphic
                    (statusBar,pFVar7,x,y_00,block->xOffset,block->yOffset,Alpha,
                     block->fullScreenOffsets);
        }
        SVar1 = this->style;
        if (SVar1 != STYLE_Strife) {
          uVar10 = (ulong)(pAVar5->Icon).texnum;
          if (uVar10 < TexMan.Textures.Count) {
            pFVar7 = TexMan.Textures.Array[TexMan.Translation.Array[uVar10]].Texture;
          }
          else {
            pFVar7 = (FTexture *)0x0;
          }
          DSBarInfo::DrawGraphic
                    (statusBar,pFVar7,
                     (SBarInfoCoordinate)((int)x + -4 + (uint)(SVar1 != STYLE_HexenStrict) * 4),
                     (SBarInfoCoordinate)((int)y_00 + -2 + (uint)(SVar1 != STYLE_HexenStrict) * 2),
                     block->xOffset,block->yOffset,block->currentAlpha,block->fullScreenOffsets);
        }
        pAVar6 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
        pAVar8 = (pAVar6->InvSel).field_0.p;
        if (pAVar8 == (AInventory *)0x0) {
LAB_006244e8:
          pAVar8 = (AInventory *)0x0;
        }
        else if (((pAVar8->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
          (pAVar6->InvSel).field_0.p = (AInventory *)0x0;
          goto LAB_006244e8;
        }
        if (pAVar5 != pAVar8) goto LAB_00624613;
        uVar12 = statusBar->invBarOffset;
        SVar11 = x;
        switch(this->style) {
        case STYLE_Heretic:
          pFVar7 = FImageCollection::operator[](this_00,uVar12 + 1);
          y = (SBarInfoCoordinate)((int)y_00 + 0x3a);
          break;
        case STYLE_Hexen:
          pFVar7 = FImageCollection::operator[](this_00,uVar12 + 1);
          y = (SBarInfoCoordinate)((int)y_00 + -2);
          break;
        case STYLE_HexenStrict:
          pFVar7 = FImageCollection::operator[](this_00,uVar12 + 1);
          SVar11 = (SBarInfoCoordinate)((int)x + -2);
          y = (SBarInfoCoordinate)((int)y_00 + -2);
          goto LAB_0062455a;
        case STYLE_Strife:
          pFVar7 = FImageCollection::operator[](this_00,uVar12 + 2);
          SVar11 = (SBarInfoCoordinate)((int)x + -0xc);
          y = (SBarInfoCoordinate)((int)y_00 + -4);
LAB_0062455a:
          iVar14 = block->xOffset;
          iVar15 = block->yOffset;
          Alpha_00 = block->currentAlpha;
          bVar17 = block->fullScreenOffsets;
          goto LAB_006245eb;
        default:
          pFVar7 = FImageCollection::operator[](this_00,uVar12 + 1);
          iVar14 = block->xOffset;
          iVar15 = block->yOffset;
          Alpha_00 = block->currentAlpha;
          bVar17 = block->fullScreenOffsets;
          y = y_00;
          goto LAB_006245eb;
        }
        iVar14 = block->xOffset;
        iVar15 = block->yOffset;
        Alpha_00 = block->currentAlpha;
        bVar17 = block->fullScreenOffsets;
LAB_006245eb:
        DSBarInfo::DrawGraphic(statusBar,pFVar7,SVar11,y,iVar14,iVar15,Alpha_00,bVar17);
LAB_00624613:
        if (this->style == STYLE_Strife) {
          uVar10 = (ulong)(pAVar5->Icon).texnum;
          if (uVar10 < TexMan.Textures.Count) {
            pFVar7 = TexMan.Textures.Array[TexMan.Translation.Array[uVar10]].Texture;
          }
          else {
            pFVar7 = (FTexture *)0x0;
          }
          DSBarInfo::DrawGraphic
                    (statusBar,pFVar7,x,y_00,block->xOffset,block->yOffset,block->currentAlpha,
                     block->fullScreenOffsets);
        }
        if ((this->counters != (CommandDrawNumber **)0x0) &&
           ((this->alwaysShowCounter != false || (pAVar5->Amount != 1)))) {
          pCVar2 = this->counters[uVar13];
          (pCVar2->super_CommandDrawString).valueArgument = pAVar5->Amount;
          (*(pCVar2->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand[2])
                    (pCVar2,block,statusBar);
        }
        pAVar5 = AInventory::NextInv(pAVar5);
        uVar13 = uVar13 + 1;
        uVar12 = this->size;
        bVar17 = pAVar5 == (AInventory *)0x0;
      } while ((!bVar17) && (iVar9 = iVar9 + iVar4 * 2, uVar13 < uVar12));
    }
  }
  if ((uint)uVar13 < uVar12) {
    iVar9 = iVar4 * (uint)uVar13 * 2;
    do {
      if (this->noArtibox != false) break;
      pFVar7 = FImageCollection::operator[](&statusBar->Images,statusBar->invBarOffset);
      bVar18 = this->vertical != false;
      iVar14 = iVar9;
      if (bVar18) {
        iVar14 = 0;
      }
      iVar15 = 0;
      if (bVar18) {
        iVar15 = iVar9;
      }
      DSBarInfo::DrawGraphic
                (statusBar,pFVar7,(SBarInfoCoordinate)(iVar14 + (int)this->x),
                 (SBarInfoCoordinate)(iVar15 + (int)this->y),block->xOffset,block->yOffset,Alpha,
                 block->fullScreenOffsets);
      uVar12 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar12;
      iVar9 = iVar9 + iVar4 * 2;
    } while (uVar12 < this->size);
  }
  if (this->noArrows != false) goto LAB_006248e9;
  pAVar8 = AActor::FirstInv(&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor);
  pAVar6 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
  pAVar5 = (pAVar6->InvFirst).field_0.p;
  if (pAVar5 == (AInventory *)0x0) {
LAB_00624828:
    pAVar5 = (AInventory *)0x0;
  }
  else if (((pAVar5->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
    (pAVar6->InvFirst).field_0.p = (AInventory *)0x0;
    goto LAB_00624828;
  }
  if (pAVar8 != pAVar5) {
    SVar1 = this->style;
    uVar12 = 0xe;
    if (SVar1 != STYLE_Strife) {
      uVar12 = (uint)(SVar1 == STYLE_HexenStrict) * 2 | 0xfffffff4;
    }
    uVar16 = -(uint)(SVar1 == STYLE_HexenStrict);
    pFVar7 = FImageCollection::operator[]
                       (&statusBar->Images,
                        (statusBar->invBarOffset - (uint)((gametic & 4U) == 0)) + 4);
    uVar3 = uVar16;
    if (this->vertical != false) {
      uVar3 = uVar12;
      uVar12 = uVar16;
    }
    DSBarInfo::DrawGraphic
              (statusBar,pFVar7,(SBarInfoCoordinate)(uVar12 * 2 + (int)this->x),
               (SBarInfoCoordinate)(uVar3 * 2 + (int)this->y),block->xOffset,block->yOffset,
               block->currentAlpha,block->fullScreenOffsets);
  }
LAB_006248e9:
  if (!bVar17 && this->noArrows == false) {
    SVar1 = this->style;
    uVar12 = this->size;
    if (SVar1 == STYLE_HexenStrict) {
      iVar4 = uVar12 * 0x1f;
    }
    else if (SVar1 == STYLE_Strife) {
      iVar4 = uVar12 * 0x23 + -4;
    }
    else {
      iVar4 = uVar12 * 0x1f + 2;
    }
    pFVar7 = FImageCollection::operator[]
                       (&statusBar->Images,
                        (statusBar->invBarOffset - (uint)((gametic & 4U) == 0)) + 6);
    iVar9 = -(uint)(SVar1 == STYLE_HexenStrict);
    if (this->vertical != false) {
      iVar9 = iVar4;
      iVar4 = -(uint)(SVar1 == STYLE_HexenStrict);
    }
    DSBarInfo::DrawGraphic
              (statusBar,pFVar7,(SBarInfoCoordinate)(iVar4 * 2 + (int)this->x),
               (SBarInfoCoordinate)(iVar9 * 2 + (int)this->y),block->xOffset,block->yOffset,
               block->currentAlpha,block->fullScreenOffsets);
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			int spacing = GetCounterSpacing(statusBar);
		
			double bgalpha = block->Alpha();
			if(translucent)
				bgalpha *= HX_SHADOW;
		
			AInventory *item;
			unsigned int i = 0;
			// If the player has no artifacts, don't draw the bar
			statusBar->CPlayer->mo->InvFirst = statusBar->ValidateInvFirst(size);
			if(statusBar->CPlayer->mo->InvFirst != NULL || alwaysShow)
			{
				for(item = statusBar->CPlayer->mo->InvFirst, i = 0; item != NULL && i < size; item = item->NextInv(), ++i)
				{
					SBarInfoCoordinate rx = x + (!vertical ? i*spacing : 0);
					SBarInfoCoordinate ry = y + (vertical ? i*spacing : 0);
					if(!noArtibox)
						statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgARTIBOX], rx, ry, block->XOffset(), block->YOffset(), bgalpha, block->FullScreenOffsets());
		
					if(style != STYLE_Strife) //Strife draws the cursor before the icons
						statusBar->DrawGraphic(TexMan(item->Icon), rx - (style == STYLE_HexenStrict ? 2 : 0), ry - (style == STYLE_HexenStrict ? 1 : 0), block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(), false, item->Amount <= 0);
					if(item == statusBar->CPlayer->mo->InvSel)
					{
						if(style == STYLE_Heretic)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx, ry+29, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else if(style == STYLE_Hexen)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx, ry-1, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else if(style == STYLE_HexenStrict)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx-1, ry-1, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else if(style == STYLE_Strife)
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgCURSOR], rx-6, ry-2, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
						else
							statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgSELECTBOX], rx, ry, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
					}
					if(style == STYLE_Strife)
						statusBar->DrawGraphic(TexMan(item->Icon), rx, ry, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(), false, item->Amount <= 0);
					if(counters != NULL && (alwaysShowCounter || item->Amount != 1))
					{
						counters[i]->valueArgument = item->Amount;
						counters[i]->Draw(block, statusBar);
					}
				}
				for (; i < size && !noArtibox; ++i)
					statusBar->DrawGraphic(statusBar->Images[statusBar->invBarOffset + imgARTIBOX], x + (!vertical ? (i*spacing) : 0), y + (vertical ? (i*spacing) : 0), block->XOffset(), block->YOffset(), bgalpha, block->FullScreenOffsets());
		
				// Is there something to the left?
				if (!noArrows && statusBar->CPlayer->mo->FirstInv() != statusBar->CPlayer->mo->InvFirst)
				{
					int offset = (style != STYLE_Strife ? (style != STYLE_HexenStrict ? -12 : -10) : 14);
					int yOffset = style != STYLE_HexenStrict ? 0 : -1;
					statusBar->DrawGraphic(statusBar->Images[!(gametic & 4) ?
						statusBar->invBarOffset + imgINVLFGEM1 : statusBar->invBarOffset + imgINVLFGEM2], x + (!vertical ? offset : yOffset), y + (vertical ? offset : yOffset), block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
				}
				// Is there something to the right?
				if (!noArrows && item != NULL)
				{
					int offset = (style != STYLE_Strife ? (style != STYLE_HexenStrict ? size*31+2 : size*31) : size*35-4);
					int yOffset = style != STYLE_HexenStrict ? 0 : -1;
					statusBar->DrawGraphic(statusBar->Images[!(gametic & 4) ?
						statusBar->invBarOffset + imgINVRTGEM1 : statusBar->invBarOffset + imgINVRTGEM2], x + (!vertical ? offset : yOffset), y + (vertical ? offset : yOffset), block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
				}
			}
		}